

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyPixels.cpp
# Opt level: O0

void anon_unknown.dwarf_af64a::writeCopyRead
               (string *tempDir,Array2D<Imath_3_2::half> *ph,int w,int h,int dx,int dy)

{
  int comp;
  string filename2;
  string filename1;
  int in_stack_00000404;
  int in_stack_00000408;
  int in_stack_0000040c;
  char *in_stack_00000410;
  char *in_stack_00000418;
  Array2D<Imath_3_2::half> *in_stack_00000420;
  int in_stack_00000430;
  Compression in_stack_00000438;
  undefined4 in_stack_ffffffffffffff90;
  int iVar1;
  undefined4 in_stack_ffffffffffffff94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string local_60 [32];
  string local_40 [64];
  
  std::operator+(in_stack_ffffffffffffff98,
                 (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  std::operator+(in_stack_ffffffffffffff98,
                 (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  for (iVar1 = 0; iVar1 < 10; iVar1 = iVar1 + 1) {
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    writeCopyRead(in_stack_00000420,in_stack_00000418,in_stack_00000410,in_stack_0000040c,
                  in_stack_00000408,in_stack_00000404,in_stack_00000430,in_stack_00000438);
  }
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void
writeCopyRead (
    const std::string&   tempDir,
    const Array2D<half>& ph,
    int                  w,
    int                  h,
    int                  dx,
    int                  dy)
{
    std::string filename1 = tempDir + "imf_test_copy1.exr";
    std::string filename2 = tempDir + "imf_test_copy2.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
        writeCopyRead (
            ph,
            filename1.c_str (),
            filename2.c_str (),
            w,
            h,
            dx,
            dy,
            Compression (comp));
    }
}